

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void update_smart_learn(monster *mon,player *p,wchar_t flag,wchar_t pflag,wchar_t element)

{
  _Bool _Var1;
  uint32_t uVar2;
  bool local_26;
  _Bool element_ok;
  wchar_t element_local;
  wchar_t pflag_local;
  wchar_t flag_local;
  player *p_local;
  monster *mon_local;
  
  local_26 = (uint)element < 0x19;
  if ((flag != L'\0') || (local_26)) {
    if (flag != L'\0') {
      equip_learn_flag(p,flag);
    }
    if (local_26) {
      equip_learn_element(p,element);
    }
    if ((((((p->opts).opt[0x28] & 1U) != 0) && (_Var1 = monster_is_stupid(mon), !_Var1)) &&
        ((_Var1 = monster_is_smart(mon), _Var1 || (uVar2 = Rand_div(2), uVar2 != 0)))) &&
       (uVar2 = Rand_div(100), uVar2 != 0)) {
      if (flag != L'\0') {
        _Var1 = player_of_has(p,flag);
        if (_Var1) {
          flag_on_dbg((mon->known_pstate).flags,5,flag,"mon->known_pstate.flags","flag");
        }
        else {
          flag_off((mon->known_pstate).flags,5,flag);
        }
      }
      if (pflag != L'\0') {
        _Var1 = flag_has_dbg((p->state).pflags,3,pflag,"p->state.pflags","pflag");
        if (_Var1) {
          flag_on_dbg((mon->known_pstate).pflags,5,pflag,"mon->known_pstate.pflags","pflag");
        }
        else {
          flag_off((mon->known_pstate).pflags,5,pflag);
        }
      }
      if (local_26) {
        (mon->known_pstate).el_info[element].res_level = (p->state).el_info[element].res_level;
      }
    }
  }
  return;
}

Assistant:

void update_smart_learn(struct monster *mon, struct player *p, int flag,
						int pflag, int element)
{
	bool element_ok = ((element >= 0) && (element < ELEM_MAX));

	/* Sanity check */
	if (!flag && !element_ok) return;

	/* Anything a monster might learn, the player should learn */
	if (flag) equip_learn_flag(p, flag);
	if (element_ok) equip_learn_element(p, element);

	/* Not allowed to learn */
	if (!OPT(p, birth_ai_learn)) return;

	/* Too stupid to learn anything */
	if (monster_is_stupid(mon)) return;

	/* Not intelligent, only learn sometimes */
	if (!monster_is_smart(mon) && one_in_(2)) return;

	/* Analyze the knowledge; fail very rarely */
	if (one_in_(100))
		return;

	/* Learn the flag */
	if (flag) {
		if (player_of_has(p, flag)) {
			of_on(mon->known_pstate.flags, flag);
		} else {
			of_off(mon->known_pstate.flags, flag);
		}
	}

	/* Learn the pflag */
	if (pflag) {
		if (pf_has(p->state.pflags, pflag)) {
			of_on(mon->known_pstate.pflags, pflag);
		} else {
			of_off(mon->known_pstate.pflags, pflag);
		}
	}

	/* Learn the element */
	if (element_ok)
		mon->known_pstate.el_info[element].res_level
			= p->state.el_info[element].res_level;
}